

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::Utf8_ByteOrderMark(void)

{
  int iVar1;
  RegEx *unaff_retaddr;
  allocator local_21;
  string local_20 [20];
  REGEX_OP in_stack_fffffffffffffff4;
  string *in_stack_fffffffffffffff8;
  
  if (Utf8_ByteOrderMark()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Utf8_ByteOrderMark()::e);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,anon_var_dwarf_d3192b,&local_21);
      RegEx::RegEx(unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
      std::__cxx11::string::~string(local_20);
      std::allocator<char>::~allocator((allocator<char> *)&local_21);
      __cxa_atexit(RegEx::~RegEx,&Utf8_ByteOrderMark::e,&__dso_handle);
      __cxa_guard_release(&Utf8_ByteOrderMark()::e);
    }
  }
  return &Utf8_ByteOrderMark::e;
}

Assistant:

inline const RegEx& Utf8_ByteOrderMark() {
  static const RegEx e = RegEx("\xEF\xBB\xBF");
  return e;
}